

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focuser_state.cpp
# Opt level: O3

void __thiscall
FS::Focuser::Focuser
          (Focuser *this,unique_ptr<NetInterface,_std::default_delete<NetInterface>_> netArg,
          unique_ptr<HWI,_std::default_delete<HWI>_> hardwareArg,
          unique_ptr<DebugInterface,_std::default_delete<DebugInterface>_> debugArg,
          BuildParams params)

{
  HWI *pHVar1;
  DebugInterface *pDVar2;
  NetInterface *pNVar3;
  WifiDebugOstream local_38;
  
  StateStack::StateStack(&this->stateStack);
  (this->debugLog)._M_t.super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>.
  _M_t.super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
  super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl = (DebugInterface *)0x0;
  (this->net)._M_t.super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>._M_t.
  super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
  super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl = (NetInterface *)0x0;
  (this->hardware)._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
  super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.super__Head_base<0UL,_HWI_*,_false>.
  _M_head_impl = (HWI *)0x0;
  (this->buildParams).timingParams.msEpochBetweenCommandChecks =
       params.timingParams.msEpochBetweenCommandChecks;
  (this->buildParams).timingParams.maxStepsBetweenChecks = params.timingParams.maxStepsBetweenChecks
  ;
  (this->buildParams).timingParams.msInactivityToSleep = params.timingParams.msInactivityToSleep;
  (this->buildParams).timingParams.msEpochForSleepCommandChecks =
       params.timingParams.msEpochForSleepCommandChecks;
  (this->buildParams).timingParams.msToPowerStepper = params.timingParams.msToPowerStepper;
  (this->buildParams).timingParams.microSecondStepPause = params.timingParams.microSecondStepPause;
  (this->buildParams).focuserHasHome = params.focuserHasHome;
  *(undefined3 *)&(this->buildParams).field_0x19 = params._25_3_;
  (this->buildParams).maxAbsPos = params.maxAbsPos;
  this->isSynched = false;
  this->time = 0;
  this->uSecRemainder = 0;
  this->timeLastInterruptingCommandOccured = 0;
  this->motorState = OFF;
  this->focuserPosition = 0;
  (this->net)._M_t.super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>._M_t.
  super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
  super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl =
       *(NetInterface **)
        netArg._M_t.super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>._M_t.
        super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
        super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl;
  *(undefined8 *)
   netArg._M_t.super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>._M_t.
   super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
   super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl = 0;
  pHVar1 = (this->hardware)._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
           super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.
           super__Head_base<0UL,_HWI_*,_false>._M_head_impl;
  (this->hardware)._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
  super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.super__Head_base<0UL,_HWI_*,_false>.
  _M_head_impl = *(HWI **)hardwareArg._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>.
                          _M_t.super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.
                          super__Head_base<0UL,_HWI_*,_false>._M_head_impl;
  *(HWI **)hardwareArg._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
           super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.
           super__Head_base<0UL,_HWI_*,_false>._M_head_impl = pHVar1;
  pDVar2 = (this->debugLog)._M_t.
           super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>._M_t.
           super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
           super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl;
  (this->debugLog)._M_t.super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>.
  _M_t.super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
  super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl =
       *(DebugInterface **)
        debugArg._M_t.super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>.
        _M_t.super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
        super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl;
  *(DebugInterface **)
   debugArg._M_t.super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>._M_t.
   super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
   super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl = pDVar2;
  pDVar2 = (this->debugLog)._M_t.
           super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>._M_t.
           super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
           super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl;
  (**pDVar2->_vptr_DebugInterface)(pDVar2,"Bringing up net interface\n",0x1a);
  pNVar3 = (this->net)._M_t.super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>.
           _M_t.super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
           super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl;
  (*pNVar3->_vptr_NetInterface[2])(pNVar3,pDVar2);
  local_38.m_wifiDebug =
       (this->net)._M_t.super___uniq_ptr_impl<NetInterface,_std::default_delete<NetInterface>_>._M_t
       .super__Tuple_impl<0UL,_NetInterface_*,_std::default_delete<NetInterface>_>.
       super__Head_base<0UL,_NetInterface_*,_false>._M_head_impl;
  local_38.m_serialDebug =
       (this->debugLog)._M_t.
       super___uniq_ptr_impl<DebugInterface,_std::default_delete<DebugInterface>_>._M_t.
       super__Tuple_impl<0UL,_DebugInterface_*,_std::default_delete<DebugInterface>_>.
       super__Head_base<0UL,_DebugInterface_*,_false>._M_head_impl;
  local_38.m_lastWasNewline = true;
  pHVar1 = (this->hardware)._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
           super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.
           super__Head_base<0UL,_HWI_*,_false>._M_head_impl;
  (*pHVar1->_vptr_HWI[3])(pHVar1,0,0);
  pHVar1 = (this->hardware)._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
           super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.
           super__Head_base<0UL,_HWI_*,_false>._M_head_impl;
  (*pHVar1->_vptr_HWI[3])(pHVar1,1,0);
  pHVar1 = (this->hardware)._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
           super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.
           super__Head_base<0UL,_HWI_*,_false>._M_head_impl;
  (*pHVar1->_vptr_HWI[3])(pHVar1,2,0);
  pHVar1 = (this->hardware)._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
           super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.
           super__Head_base<0UL,_HWI_*,_false>._M_head_impl;
  (*pHVar1->_vptr_HWI[3])(pHVar1,3,1);
  setMotor(this,&local_38,ON);
  this->dir = FORWARD;
  pHVar1 = (this->hardware)._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
           super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.
           super__Head_base<0UL,_HWI_*,_false>._M_head_impl;
  (*pHVar1->_vptr_HWI[2])(pHVar1,1,2);
  pHVar1 = (this->hardware)._M_t.super___uniq_ptr_impl<HWI,_std::default_delete<HWI>_>._M_t.
           super__Tuple_impl<0UL,_HWI_*,_std::default_delete<HWI>_>.
           super__Head_base<0UL,_HWI_*,_false>._M_head_impl;
  (*pHVar1->_vptr_HWI[2])(pHVar1,0,1);
  ::operator<<(&local_38,"Focuser is up\n");
  return;
}

Assistant:

Focuser::Focuser(
    std::unique_ptr<NetInterface> netArg,
    std::unique_ptr<HWI> hardwareArg,
    std::unique_ptr<DebugInterface> debugArg,
    const BuildParams params
) : buildParams{ params }
{
  focuserPosition = 0;
  isSynched = false;
  time = 0;
  uSecRemainder = 0;
  timeLastInterruptingCommandOccured = 0;
  motorState = MotorState::OFF;

  std::swap( net, netArg );
  std::swap( hardware, hardwareArg );
  std::swap( debugLog, debugArg );
  
  DebugInterface& dlog = *debugLog;
  dlog << "Bringing up net interface\n";
  
  // Bring up the interface to the controlling computer

  net->setup( dlog );
  WifiDebugOstream log( debugLog.get(), net.get() );

  //
  // Set the pin modes 
  //
  hardware->PinMode(HWI::Pin::STEP,       HWI::PinIOMode::M_OUTPUT );  
  hardware->PinMode(HWI::Pin::DIR,        HWI::PinIOMode::M_OUTPUT );  
  hardware->PinMode(HWI::Pin::MOTOR_ENA,  HWI::PinIOMode::M_OUTPUT );  
  hardware->PinMode(HWI::Pin::HOME,       HWI::PinIOMode::M_INPUT ); 
 
  //
  // Set the output pin defaults and internal state
  // 
  setMotor( log, MotorState::ON ); 

  dir = Dir::FORWARD;
  hardware->DigitalWrite( HWI::Pin::DIR, HWI::PinState::DIR_FORWARD); 
  hardware->DigitalWrite( HWI::Pin::STEP, HWI::PinState::STEP_INACTIVE );

  log << "Focuser is up\n";
}